

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcProjectionCurve::~IfcProjectionCurve(IfcProjectionCurve *this)

{
  ~IfcProjectionCurve((IfcProjectionCurve *)
                      (&(this->super_IfcAnnotationCurveOccurrence).super_IfcAnnotationOccurrence.
                        super_IfcStyledItem.field_0x0 +
                      *(long *)(*(long *)&(this->super_IfcAnnotationCurveOccurrence).
                                          super_IfcAnnotationOccurrence.super_IfcStyledItem + -0x18)
                      ));
  return;
}

Assistant:

IfcProjectionCurve() : Object("IfcProjectionCurve") {}